

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

bool __thiscall
helics::FilterFederate::destinationProcessMessage
          (FilterFederate *this,ActionMessage *command,BasicHandleInfo *handle)

{
  bool bVar1;
  __type_conflict _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  BasicHandleInfo *in_RDX;
  ActionMessage *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ActionMessage *unaff_retaddr;
  uint32_t in_stack_0000000c;
  FilterFederate *in_stack_00000010;
  Time in_stack_00000018;
  GlobalFederateId in_stack_00000024;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> nmessage;
  string odest;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> tempMessage;
  GlobalFederateId fed_id;
  __int_type_conflict1 mid;
  FilterCoordinator *ffunc;
  ActionMessage *in_stack_00000218;
  BasicHandleInfo *in_stack_00000220;
  FilterCoordinator *in_stack_00000228;
  FilterFederate *in_stack_00000230;
  ActionMessage *in_stack_ffffffffffffff18;
  ActionMessage *__args;
  function<void_(helics::ActionMessage_&&)> *in_stack_ffffffffffffff20;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *in_stack_ffffffffffffff30;
  FilterInfo *__rhs;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  Time in_stack_ffffffffffffff70;
  InterfaceHandle in_stack_ffffffffffffff7c;
  ActionMessage *in_stack_ffffffffffffff98;
  BaseType local_54;
  GlobalFederateId local_50;
  BaseType local_4c;
  baseType local_48;
  BaseType local_3c;
  BaseType local_38;
  uint32_t local_34;
  BaseType local_30;
  BaseType local_2c;
  FilterCoordinator *local_28;
  BasicHandleInfo *local_20;
  ActionMessage *local_18;
  undefined7 in_stack_fffffffffffffff8;
  byte in_stack_ffffffffffffffff;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_2c = (BaseType)BasicHandleInfo::getInterfaceHandle(in_RDX);
  local_28 = getFilterCoordinator
                       ((FilterFederate *)in_stack_ffffffffffffff70.internalTimeCode,
                        in_stack_ffffffffffffff7c);
  if (local_28 != (FilterCoordinator *)0x0) {
    if ((local_28->destFilter != (FilterInfo *)0x0) &&
       (bVar1 = checkActionFlag<helics::FilterInfo,helics::ConnectionFlags>
                          (local_28->destFilter,disconnected_flag), !bVar1)) {
      __rhs = local_28->destFilter;
      local_30 = (BaseType)
                 GlobalFederateId::operator_cast_to_GlobalBrokerId
                           ((GlobalFederateId *)in_stack_ffffffffffffff18);
      bVar1 = GlobalBrokerId::operator!=(&__rhs->core_id,(GlobalBrokerId)local_30);
      if (bVar1) {
        local_34 = std::__atomic_base<int>::operator++
                             ((__atomic_base<int> *)&in_RDI[0x23]._M_string_length);
        local_38 = (BaseType)BasicHandleInfo::getFederateId(local_20);
        local_3c = (BaseType)BasicHandleInfo::getFederateId(local_20);
        local_48 = (local_18->actionTime).internalTimeCode;
        generateDestProcessMarker
                  (in_stack_00000010,in_stack_00000024,in_stack_0000000c,in_stack_00000018);
        ActionMessage::setAction(local_18,cmd_send_for_dest_filter_return);
        local_18->sequenceID = local_34;
        (local_18->source_id).gid = local_38;
        local_4c = (BaseType)BasicHandleInfo::getInterfaceHandle(local_20);
        (local_18->source_handle).hid = local_4c;
        local_54 = (local_28->destFilter->core_id).gid;
        GlobalFederateId::GlobalFederateId(&local_50,(GlobalBrokerId)local_54);
        (local_18->dest_id).gid = local_50.gid;
        (local_18->dest_handle).hid = (local_28->destFilter->handle).hid;
        std::function<void_(helics::ActionMessage_&&)>::operator()
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        in_stack_ffffffffffffffff = 0;
        goto LAB_0065a67a;
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)&local_28->destFilter->filterOp);
      if (bVar1) {
        in_stack_ffffffffffffff30 =
             (vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
             &stack0xffffffffffffffa0;
        createMessageFromCommand(in_stack_ffffffffffffff98);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x65a485);
        std::__cxx11::string::string(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  __shared_ptr_access<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x65a4b0);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)this_00,
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_ffffffffffffff18);
        (**(code **)((long)*(tuple<helics::Message_*,_std::default_delete<helics::Message>_> *)
                            &((_Function_base *)&this_00->_M_dataplus)->_M_functor + 0x10))
                  (&stack0xffffffffffffff68,this_00,&stack0xffffffffffffff60);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_ffffffffffffff30);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x65a4fa);
        _Var2 = std::operator==(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__rhs);
        if (_Var2) {
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)this_00,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_ffffffffffffff18);
          ActionMessage::operator=
                    (unaff_retaddr,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_ffffffffffffff30);
        }
        else {
          __args = (ActionMessage *)local_b0;
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)this_00,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)__args);
          ActionMessage::operator=
                    (unaff_retaddr,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_ffffffffffffff30);
          std::function<void_(helics::ActionMessage_&)>::operator()
                    ((function<void_(helics::ActionMessage_&)> *)this_00,__args);
          in_stack_ffffffffffffffff = 0;
        }
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_ffffffffffffff30);
        std::__cxx11::string::~string(this_00);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_ffffffffffffff30);
        if (!_Var2) goto LAB_0065a67a;
      }
    }
    bVar1 = std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::empty
                      (in_stack_ffffffffffffff30);
    if (!bVar1) {
      runCloningDestinationFilters
                (in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_00000218);
    }
  }
  in_stack_ffffffffffffffff = 1;
LAB_0065a67a:
  return (bool)(in_stack_ffffffffffffffff & 1);
}

Assistant:

bool FilterFederate::destinationProcessMessage(ActionMessage& command,
                                               const BasicHandleInfo* handle)
{
    auto* ffunc = getFilterCoordinator(handle->getInterfaceHandle());
    if (ffunc != nullptr) {
        if (ffunc->destFilter != nullptr) {
            if (!checkActionFlag(*(ffunc->destFilter), disconnected_flag)) {
                if (ffunc->destFilter->core_id != mFedID) {  // now we have deal with non-local
                                                             // processing destination filter
                    // first block the federate time advancement until the return is
                    // received
                    auto mid = ++messageCounter;
                    auto fed_id = handle->getFederateId();
                    generateDestProcessMarker(handle->getFederateId(), mid, command.actionTime);

                    // now send a message to get filtered
                    command.setAction(CMD_SEND_FOR_DEST_FILTER_AND_RETURN);
                    command.sequenceID = mid;
                    command.source_id = fed_id;
                    command.source_handle = handle->getInterfaceHandle();
                    command.dest_id = ffunc->destFilter->core_id;
                    command.dest_handle = ffunc->destFilter->handle;

                    mSendMessageMove(std::move(command));
                    return false;
                }
                // the filter is part of this core

                if (ffunc->destFilter->filterOp) {
                    auto tempMessage = createMessageFromCommand(std::move(command));
                    auto odest = tempMessage->dest;
                    auto nmessage = ffunc->destFilter->filterOp->process(std::move(tempMessage));
                    if (odest == nmessage->dest) {
                        command = std::move(nmessage);
                    } else {
                        // handle destination reroute filters
                        command = std::move(nmessage);
                        mDeliverMessage(command);
                        return false;
                    }
                }
            }
        }
        if (!ffunc->cloningDestFilters.empty()) {
            runCloningDestinationFilters(ffunc, handle, command);
        }
    }
    return true;
}